

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.hpp
# Opt level: O3

void __thiscall
cs_function_invoker_impl::function_invoker<void(cs::numeric)>::operator()
          (function_invoker<void(cs::numeric)> *this,int *args)

{
  char *pcVar1;
  int iVar2;
  undefined *puVar3;
  object_method *poVar4;
  callable *pcVar5;
  runtime_error *this_00;
  long lVar6;
  initializer_list<cs_impl::any> __l;
  initializer_list<cs_impl::any> __l_00;
  vector args_1;
  allocator_type local_69;
  undefined1 local_68 [16];
  undefined1 local_58 [32];
  anon_union_16_2_310e9938_for_data local_38;
  undefined1 local_28;
  
  local_38._int = (numeric_integer)*args;
  local_28 = 1;
  if (*(long *)this == 0) {
    puVar3 = &void::typeinfo;
  }
  else {
    puVar3 = (undefined *)(**(code **)(**(long **)(*(long *)this + 0x10) + 0x10))();
  }
  pcVar1 = *(char **)(puVar3 + 8);
  if (pcVar1 == "N2cs8callableE") {
LAB_001219d0:
    cs_impl::any::any<cs::numeric>((any *)local_68,(numeric *)&local_38);
    __l._M_len = 1;
    __l._M_array = (iterator)local_68;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)local_58,__l,&local_69);
    cs_impl::any::recycle((any *)local_68);
    pcVar5 = cs_impl::any::const_val<cs::callable>((any *)this);
    if ((pcVar5->mFunc).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(pcVar5->mFunc)._M_invoker)
              ((_Any_data *)local_68,(vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)pcVar5);
  }
  else {
    if (*pcVar1 != '*') {
      iVar2 = strcmp(pcVar1,"N2cs8callableE");
      if (iVar2 == 0) goto LAB_001219d0;
    }
    if (*(long *)this == 0) {
      puVar3 = &void::typeinfo;
    }
    else {
      puVar3 = (undefined *)(**(code **)(**(long **)(*(long *)this + 0x10) + 0x10))();
    }
    pcVar1 = *(char **)(puVar3 + 8);
    if (pcVar1 != "N2cs13object_methodE") {
      if (*pcVar1 == '*') {
LAB_00121afc:
        this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_58._0_8_ = local_58 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_58,"Invoke non-callable object.","");
        cs::runtime_error::runtime_error(this_00,(string *)local_58);
        __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
      }
      iVar2 = strcmp(pcVar1,"N2cs13object_methodE");
      if (iVar2 != 0) goto LAB_00121afc;
    }
    poVar4 = cs_impl::any::const_val<cs::object_method>((any *)this);
    local_68._0_8_ = (poVar4->object).mDat;
    if ((proxy *)local_68._0_8_ != (proxy *)0x0) {
      ((proxy *)local_68._0_8_)->refcount = ((proxy *)local_68._0_8_)->refcount + 1;
    }
    cs_impl::any::any<cs::numeric>((any *)(local_68 + 8),(numeric *)&local_38);
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)local_68;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)local_58,__l_00,&local_69);
    lVar6 = 8;
    do {
      cs_impl::any::recycle((any *)(local_68 + lVar6));
      lVar6 = lVar6 + -8;
    } while (lVar6 != -8);
    pcVar5 = cs_impl::any::const_val<cs::callable>(&poVar4->callable);
    if ((pcVar5->mFunc).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(pcVar5->mFunc)._M_invoker)
              ((_Any_data *)local_68,(vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)pcVar5);
  }
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
            ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)local_58);
  cs_impl::any::recycle((any *)local_68);
  return;
}

Assistant:

RetT operator()(ElementT &&...args) const
		{
			return convert_helper<RetT>::get_val(cs::invoke(m_func, cs_impl::type_convertor<ElementT, ArgsT>::convert(
			        std::forward<ElementT>(args))...));
		}